

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ColumnInfo>
          (Serializer *this,vector<duckdb::ColumnInfo,_true> *vec)

{
  bool bVar1;
  vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_> *in_RSI;
  Serializer *in_RDI;
  ColumnInfo *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<duckdb::ColumnInfo,_true> *__range2;
  size_type count;
  ColumnInfo *in_stack_ffffffffffffffb8;
  __normal_iterator<const_duckdb::ColumnInfo_*,_std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>_>
  local_28;
  vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_> *local_20;
  size_type local_18;
  vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_> *local_10;
  
  local_10 = in_RSI;
  local_18 = ::std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>::size(in_RSI);
  (*(code *)((ColumnInfo *)in_RDI->_vptr_Serializer)[1].names.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage)(in_RDI,local_18);
  local_20 = local_10;
  local_28._M_current =
       (ColumnInfo *)
       ::std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>::begin
                 (in_stack_ffffffffffffffb8);
  ::std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>::end
            ((vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_> *)
             in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::ColumnInfo_*,_std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_duckdb::ColumnInfo_*,_std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_duckdb::ColumnInfo_*,_std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>_>
    ::operator*(&local_28);
    WriteValue<duckdb::ColumnInfo>(in_RDI,in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<const_duckdb::ColumnInfo_*,_std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>_>
    ::operator++(&local_28);
  }
  (*(code *)((ColumnInfo *)in_RDI->_vptr_Serializer)[1].types.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start)();
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}